

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

int set_vt_partitioning(AV1_COMP *cpi,MACROBLOCKD *xd,TileInfo *tile,void *data,BLOCK_SIZE bsize,
                       int mi_row,int mi_col,int64_t threshold,BLOCK_SIZE bsize_min,
                       PART_EVAL_STATUS force_split)

{
  BLOCK_SIZE BVar1;
  uint mi_row_00;
  uint mi_col_00;
  uint uVar2;
  int iVar3;
  AV1_COMMON *cm_00;
  void *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  BLOCK_SIZE in_R8B;
  int in_R9D;
  int in_stack_00000008;
  BLOCK_SIZE plane_bsize_1;
  BLOCK_SIZE subsize_1;
  BLOCK_SIZE plane_bsize;
  BLOCK_SIZE subsize;
  int bs_height_horiz_check;
  int bs_width_vert_check;
  int bs_height_check;
  int bs_width_check;
  int block_height;
  int block_width;
  variance_node vt;
  AV1_COMMON *cm;
  PARTITION_TYPE in_stack_ffffffffffffff85;
  BLOCK_SIZE in_stack_ffffffffffffff86;
  int local_78;
  int local_74;
  uint local_70;
  BLOCK_SIZE bsize_00;
  AV1_COMP *in_stack_ffffffffffffffa0;
  int local_4;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  mi_row_00 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [in_R8B];
  mi_col_00 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [in_R8B];
  local_74 = (int)mi_row_00 >> 1;
  local_78 = (int)mi_col_00 >> 1;
  local_70 = mi_col_00;
  uVar2 = mi_row_00;
  if (*(char *)(*(long *)(in_RDI + 0x42008) + 0x1c) == '\f') {
    if (*(int *)(in_RDX + 0xc) == *(int *)(in_RDI + 0x3c198)) {
      uVar2 = local_74 + 1;
      local_74 = ((int)mi_row_00 >> 2) + 1;
    }
    if (*(int *)(in_RDX + 4) == *(int *)(in_RDI + 0x3c194)) {
      local_70 = local_78 + 1;
      local_78 = ((int)mi_col_00 >> 2) + 1;
    }
  }
  tree_to_node(in_RCX,in_R8B,(variance_node *)&stack0xffffffffffffffa0);
  if (((*(int *)(in_RDX + 0xc) < (int)(in_stack_00000008 + uVar2)) ||
      (*(int *)(in_RDX + 4) < (int)(in_R9D + local_70))) || ((char)block_height != '\x02')) {
    if ((char)block_height == '\x01') {
      local_4 = 0;
    }
    else if (in_R8B == (BLOCK_SIZE)bs_height_check) {
      iVar3 = frame_is_intra_only(cm_00);
      if (iVar3 != 0) {
        get_variance((VPartVar *)in_stack_ffffffffffffffa0);
      }
      if (((*(int *)(in_RDX + 0xc) < (int)(in_stack_00000008 + uVar2)) ||
          (*(int *)(in_RDX + 4) < (int)(in_R9D + local_70))) ||
         (_bs_height_horiz_check <= *(int *)&in_stack_ffffffffffffffa0->field_0xc)) {
        local_4 = 0;
      }
      else {
        set_block_size(in_stack_ffffffffffffffa0,mi_row_00,mi_col_00,(BLOCK_SIZE)(uVar2 >> 0x18));
        local_4 = 1;
      }
    }
    else if ((BLOCK_SIZE)bs_height_check < in_R8B) {
      iVar3 = frame_is_intra_only(cm_00);
      if (iVar3 != 0) {
        get_variance((VPartVar *)in_stack_ffffffffffffffa0);
      }
      iVar3 = frame_is_intra_only(cm_00);
      if ((iVar3 == 0) ||
         ((in_R8B < BLOCK_32X64 &&
          ((long)*(int *)&in_stack_ffffffffffffffa0->field_0xc <= _bs_height_horiz_check * 0x10))))
      {
        if ((*(int *)(in_RDX + 0xc) < (int)(in_stack_00000008 + uVar2)) ||
           ((*(int *)(in_RDX + 4) < (int)(in_R9D + local_70) ||
            (_bs_height_horiz_check <= *(int *)&in_stack_ffffffffffffffa0->field_0xc)))) {
          if (((int)(in_R9D + local_70) <= *(int *)(in_RDX + 4)) &&
             (in_stack_00000008 + local_74 <= *(int *)(in_RDX + 0xc))) {
            BVar1 = get_partition_subsize(in_stack_ffffffffffffff86,in_stack_ffffffffffffff85);
            in_stack_ffffffffffffff86 =
                 get_plane_block_size(BVar1,*(int *)(in_RSI + 0xa44),*(int *)(in_RSI + 0xa48));
            get_variance((VPartVar *)
                         ((in_stack_ffffffffffffffa0->enc_quant_dequant_params).quants.y_quant + 2))
            ;
            get_variance((VPartVar *)
                         ((in_stack_ffffffffffffffa0->enc_quant_dequant_params).quants.y_quant + 3))
            ;
            if (((*(int *)((in_stack_ffffffffffffffa0->enc_quant_dequant_params).quants.y_quant[2] +
                          6) < _bs_height_horiz_check) &&
                (*(int *)((in_stack_ffffffffffffffa0->enc_quant_dequant_params).quants.y_quant[3] +
                         6) < _bs_height_horiz_check)) &&
               (in_stack_ffffffffffffff86 != BLOCK_INVALID)) {
              set_block_size(in_stack_ffffffffffffffa0,mi_row_00,mi_col_00,
                             (BLOCK_SIZE)(uVar2 >> 0x18));
              set_block_size(in_stack_ffffffffffffffa0,mi_row_00,mi_col_00,
                             (BLOCK_SIZE)(uVar2 >> 0x18));
              return 1;
            }
          }
          if (((int)(in_stack_00000008 + uVar2) <= *(int *)(in_RDX + 0xc)) &&
             (in_R9D + local_78 <= *(int *)(in_RDX + 4))) {
            BVar1 = get_partition_subsize(in_stack_ffffffffffffff86,in_stack_ffffffffffffff85);
            bsize_00 = (BLOCK_SIZE)(uVar2 >> 0x18);
            BVar1 = get_plane_block_size(BVar1,*(int *)(in_RSI + 0xa44),*(int *)(in_RSI + 0xa48));
            get_variance((VPartVar *)&in_stack_ffffffffffffffa0->enc_quant_dequant_params);
            get_variance((VPartVar *)
                         ((in_stack_ffffffffffffffa0->enc_quant_dequant_params).quants.y_quant + 1))
            ;
            if ((*(int *)((in_stack_ffffffffffffffa0->enc_quant_dequant_params).quants.y_quant[0] +
                         6) < _bs_height_horiz_check) &&
               ((*(int *)((in_stack_ffffffffffffffa0->enc_quant_dequant_params).quants.y_quant[1] +
                         6) < _bs_height_horiz_check && (BVar1 != BLOCK_INVALID)))) {
              set_block_size(in_stack_ffffffffffffffa0,mi_row_00,mi_col_00,bsize_00);
              set_block_size(in_stack_ffffffffffffffa0,mi_row_00,mi_col_00,bsize_00);
              return 1;
            }
          }
          local_4 = 0;
        }
        else {
          set_block_size(in_stack_ffffffffffffffa0,mi_row_00,mi_col_00,(BLOCK_SIZE)(uVar2 >> 0x18));
          local_4 = 1;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    set_block_size(in_stack_ffffffffffffffa0,mi_row_00,mi_col_00,(BLOCK_SIZE)(uVar2 >> 0x18));
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int set_vt_partitioning(AV1_COMP *cpi, MACROBLOCKD *const xd,
                               const TileInfo *const tile, void *data,
                               BLOCK_SIZE bsize, int mi_row, int mi_col,
                               int64_t threshold, BLOCK_SIZE bsize_min,
                               PART_EVAL_STATUS force_split) {
  AV1_COMMON *const cm = &cpi->common;
  variance_node vt;
  const int block_width = mi_size_wide[bsize];
  const int block_height = mi_size_high[bsize];
  int bs_width_check = block_width;
  int bs_height_check = block_height;
  int bs_width_vert_check = block_width >> 1;
  int bs_height_horiz_check = block_height >> 1;
  // On the right and bottom boundary we only need to check
  // if half the bsize fits, because boundary is extended
  // up to 64. So do this check only for sb_size = 64X64.
  if (cm->seq_params->sb_size == BLOCK_64X64) {
    if (tile->mi_col_end == cm->mi_params.mi_cols) {
      bs_width_check = (block_width >> 1) + 1;
      bs_width_vert_check = (block_width >> 2) + 1;
    }
    if (tile->mi_row_end == cm->mi_params.mi_rows) {
      bs_height_check = (block_height >> 1) + 1;
      bs_height_horiz_check = (block_height >> 2) + 1;
    }
  }

  assert(block_height == block_width);
  tree_to_node(data, bsize, &vt);

  if (mi_col + bs_width_check <= tile->mi_col_end &&
      mi_row + bs_height_check <= tile->mi_row_end &&
      force_split == PART_EVAL_ONLY_NONE) {
    set_block_size(cpi, mi_row, mi_col, bsize);
    return 1;
  }
  if (force_split == PART_EVAL_ONLY_SPLIT) return 0;

  // For bsize=bsize_min (16x16/8x8 for 8x8/4x4 downsampling), select if
  // variance is below threshold, otherwise split will be selected.
  // No check for vert/horiz split as too few samples for variance.
  if (bsize == bsize_min) {
    // Variance already computed to set the force_split.
    if (frame_is_intra_only(cm)) get_variance(&vt.part_variances->none);
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_check <= tile->mi_row_end &&
        vt.part_variances->none.variance < threshold) {
      set_block_size(cpi, mi_row, mi_col, bsize);
      return 1;
    }
    return 0;
  } else if (bsize > bsize_min) {
    // Variance already computed to set the force_split.
    if (frame_is_intra_only(cm)) get_variance(&vt.part_variances->none);
    // For key frame: take split for bsize above 32X32 or very high variance.
    if (frame_is_intra_only(cm) &&
        (bsize > BLOCK_32X32 ||
         vt.part_variances->none.variance > (threshold << 4))) {
      return 0;
    }
    // If variance is low, take the bsize (no split).
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_check <= tile->mi_row_end &&
        vt.part_variances->none.variance < threshold) {
      set_block_size(cpi, mi_row, mi_col, bsize);
      return 1;
    }
    // Check vertical split.
    if (mi_row + bs_height_check <= tile->mi_row_end &&
        mi_col + bs_width_vert_check <= tile->mi_col_end) {
      BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_VERT);
      BLOCK_SIZE plane_bsize =
          get_plane_block_size(subsize, xd->plane[AOM_PLANE_U].subsampling_x,
                               xd->plane[AOM_PLANE_U].subsampling_y);
      get_variance(&vt.part_variances->vert[0]);
      get_variance(&vt.part_variances->vert[1]);
      if (vt.part_variances->vert[0].variance < threshold &&
          vt.part_variances->vert[1].variance < threshold &&
          plane_bsize < BLOCK_INVALID) {
        set_block_size(cpi, mi_row, mi_col, subsize);
        set_block_size(cpi, mi_row, mi_col + block_width / 2, subsize);
        return 1;
      }
    }
    // Check horizontal split.
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_horiz_check <= tile->mi_row_end) {
      BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_HORZ);
      BLOCK_SIZE plane_bsize =
          get_plane_block_size(subsize, xd->plane[AOM_PLANE_U].subsampling_x,
                               xd->plane[AOM_PLANE_U].subsampling_y);
      get_variance(&vt.part_variances->horz[0]);
      get_variance(&vt.part_variances->horz[1]);
      if (vt.part_variances->horz[0].variance < threshold &&
          vt.part_variances->horz[1].variance < threshold &&
          plane_bsize < BLOCK_INVALID) {
        set_block_size(cpi, mi_row, mi_col, subsize);
        set_block_size(cpi, mi_row + block_height / 2, mi_col, subsize);
        return 1;
      }
    }
    return 0;
  }
  return 0;
}